

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O3

void err_msg<unsigned_int,unsigned_int>(string *msg,uint t,uint u,bool expected)

{
  ostream *poVar1;
  string local_68;
  string local_48;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(msg->_M_dataplus)._M_p,msg->_M_string_length);
  to_hex<unsigned_int>(&local_48,t);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  to_hex<unsigned_int>(&local_68,u);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", expected = ",0xd);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void err_msg(const std::string& msg, T t, U u, bool expected)
{
	std::cerr << msg << to_hex(t) << ", " << to_hex(u) << ", expected = " << expected << std::endl;
}